

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x86ADD(uchar *stream,x86Reg dst,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift)

{
  uchar *puVar1;
  uint uVar2;
  byte bVar3;
  
  if (1 < size - sDWORD) {
    __assert_fail("size == sDWORD || size == sQWORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x46a,"int x86ADD(unsigned char *, x86Reg, x86Size, x86Reg, int, x86Reg, int)");
  }
  bVar3 = 8 < (int)base | (8 < (int)index) * '\x02' | (8 < (int)dst) << 2 | (size == sQWORD) << 3;
  if (bVar3 != 0) {
    *stream = bVar3 | 0x40;
  }
  puVar1 = stream + (bVar3 != 0);
  *puVar1 = '\x03';
  uVar2 = encodeAddress(puVar1 + 1,index,multiplier,base,shift,(int)regCode[dst]);
  return (uVar2 + (int)(puVar1 + 1)) - (int)stream;
}

Assistant:

int x86ADD(unsigned char *stream, x86Reg dst, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	assert(size == sDWORD || size == sQWORD);

	stream += encodeRex(stream, size == sQWORD, dst, index, base);

	*stream++ = 0x03;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[dst]);

	return int(stream - start);
}